

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Convolution2D.cpp
# Opt level: O1

void __thiscall
layer::Convolution2D::majWeight(Convolution2D *this,scalar learningRate,scalar add,scalar multi)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  tensor ppplVar11;
  tensor ppplVar12;
  tensor *pppplVar13;
  longdouble *plVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  uint uVar19;
  long lVar20;
  uint uVar21;
  ulong uVar22;
  ulong local_70;
  
  lVar15 = (long)(this->super_Layer)._sizeZOut;
  if (0 < lVar15) {
    uVar1 = (this->super_Layer)._sizeXOut;
    uVar2 = (this->super_Layer)._sizeYOut;
    lVar18 = 0;
    do {
      if (0 < (int)uVar2) {
        uVar3 = (this->super_Layer)._sizeZWeight;
        local_70 = 0;
        do {
          if (0 < (int)uVar1) {
            iVar4 = this->_stepY;
            iVar5 = this->_zeroPaddingY;
            uVar6 = (this->super_Layer)._sizeYWeight;
            uVar17 = 0;
            do {
              if (0 < (int)uVar3) {
                iVar7 = this->_sizeYIn;
                uVar22 = 0;
                do {
                  if (0 < (int)uVar6) {
                    iVar8 = this->_stepX;
                    iVar9 = this->_zeroPaddingX;
                    uVar10 = (this->super_Layer)._sizeXWeight;
                    uVar16 = 0;
                    uVar19 = iVar4 * (int)local_70 - iVar5;
                    do {
                      if ((-1 < (int)uVar19 && 0 < (int)uVar10) && (int)uVar19 < iVar7) {
                        ppplVar11 = (this->super_Layer)._in;
                        ppplVar12 = (this->super_Layer)._delta;
                        pppplVar13 = (this->super_Layer)._ptrWeight;
                        lVar20 = 0;
                        uVar21 = iVar8 * (int)uVar17 - iVar9;
                        do {
                          if ((int)uVar21 < iVar7 && -1 < (int)uVar21) {
                            plVar14 = pppplVar13[lVar18][uVar22][uVar16];
                            *(longdouble *)((long)plVar14 + lVar20) =
                                 *(longdouble *)((long)plVar14 + lVar20) +
                                 ppplVar11[uVar22][uVar19][uVar21] *
                                 ppplVar12[lVar18][local_70][uVar17] * learningRate._0_10_ *
                                 multi._0_10_ + add._0_10_;
                          }
                          uVar21 = uVar21 + 1;
                          lVar20 = lVar20 + 0x10;
                        } while ((ulong)uVar10 << 4 != lVar20);
                      }
                      uVar19 = uVar19 + 1;
                      uVar16 = uVar16 + 1;
                    } while (uVar16 != uVar6);
                  }
                  uVar22 = uVar22 + 1;
                } while (uVar22 != uVar3);
              }
              uVar17 = uVar17 + 1;
            } while (uVar17 != uVar1);
          }
          local_70 = local_70 + 1;
        } while (local_70 != uVar2);
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 != lVar15);
  }
  return;
}

Assistant:

void Convolution2D::majWeight(type::scalar learningRate, type::scalar add, type::scalar multi)
    {

        int posXIn = 0;
        int posYIn = 0;


        for (int posZOut(0); posZOut < _sizeZOut; posZOut++) {
            for (int posYOut(0); posYOut < _sizeYOut; posYOut++) {
                for (int posXOut(0); posXOut < _sizeXOut; posXOut++) {

                    for (int posZKernel(0); posZKernel < _sizeZWeight; posZKernel++) {
                        posYIn = (posYOut * _stepY) - _zeroPaddingY;
                        for (int posYKernel(0); posYKernel < _sizeYWeight; posYKernel++) {
                            if((posYIn >= 0) & (posYIn < _sizeYIn)) {
                                posXIn = (posXOut * _stepX) - _zeroPaddingX;
                                for (int posXKernel(0); posXKernel < _sizeXWeight; posXKernel++) {
                                    if((posXIn >= 0) & (posXIn < _sizeYIn)) {
                                        _ptrWeight[posZOut][posZKernel][posYKernel][posXKernel] +=
                                                (learningRate * _delta[posZOut][posYOut][posXOut] *
                                                 _in[posZKernel][posYIn][posXIn] * multi) + add;
                                    }
                                    posXIn++;
                                }
                            }
                            posYIn++;
                        }
                    }
                }
            }
        }

    }